

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O1

mbedtls_pk_info_t * mbedtls_pk_info_from_type(mbedtls_pk_type_t pk_type)

{
  if (pk_type - MBEDTLS_PK_RSA < 4) {
    return (mbedtls_pk_info_t *)(&PTR_mbedtls_rsa_info_00152c10)[pk_type - MBEDTLS_PK_RSA];
  }
  return (mbedtls_pk_info_t *)0x0;
}

Assistant:

const mbedtls_pk_info_t * mbedtls_pk_info_from_type( mbedtls_pk_type_t pk_type )
{
    switch( pk_type ) {
#if defined(MBEDTLS_RSA_C)
        case MBEDTLS_PK_RSA:
            return( &mbedtls_rsa_info );
#endif
#if defined(MBEDTLS_ECP_C)
        case MBEDTLS_PK_ECKEY:
            return( &mbedtls_eckey_info );
        case MBEDTLS_PK_ECKEY_DH:
            return( &mbedtls_eckeydh_info );
#endif
#if defined(MBEDTLS_ECDSA_C)
        case MBEDTLS_PK_ECDSA:
            return( &mbedtls_ecdsa_info );
#endif
        /* MBEDTLS_PK_RSA_ALT omitted on purpose */
        default:
            return( NULL );
    }
}